

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>
::operator()(BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  short sVar1;
  reference x;
  reference y;
  size_t c2_local;
  size_t c1_local;
  size_t c0_local;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>
  *this_local;
  
  x = View<short,false,std::allocator<unsigned_long>>::operator()
                ((View<short,false,std::allocator<unsigned_long>> *)this->e1_,c0,c1,c2);
  y = View<short,false,std::allocator<unsigned_long>>::operator()
                ((View<short,false,std::allocator<unsigned_long>> *)this->e2_,c0,c1,c2);
  sVar1 = marray_detail::Times<short,_short,_short>::operator()
                    ((Times<short,_short,_short> *)&this->field_0x10,x,y);
  return sVar1;
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e1_(c0, c1, c2), e2_(c0, c1, c2)); }